

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclWriteLiberty(char *pFileName,SC_Lib *p)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int iVar7;
  int i;
  int iVar8;
  int i_00;
  float fVar9;
  float fVar10;
  size_t sStack_80;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    pcVar2 = "Cannot open text file \"%s\" for writing.\n";
    goto LAB_0036a3e6;
  }
  pcVar2 = Extra_TimeStamp();
  fprintf(__stream,"/* This Liberty file was generated by ABC on %s */\n",pcVar2);
  fprintf(__stream,"/* The original unabridged library came from file \"%s\".*/\n\n",p->pFileName);
  fprintf(__stream,"library(%s) {\n\n",p->pName);
  if ((p->default_wire_load != (char *)0x0) && (*p->default_wire_load != '\0')) {
    fprintf(__stream,"  default_wire_load : \"%s\";\n");
  }
  if ((p->default_wire_load_sel != (char *)0x0) && (*p->default_wire_load_sel != '\0')) {
    fprintf(__stream,"  default_wire_load_selection : \"%s\";\n");
  }
  fVar9 = p->default_max_out_slew;
  if ((fVar9 != -1.0) || (NAN(fVar9))) {
    fprintf(__stream,"  default_max_transition : %f;\n",(double)fVar9);
  }
  switch(p->unit_time) {
  case 9:
    pcVar2 = "  time_unit : \"1ns\";\n";
    goto LAB_00369d1b;
  case 10:
    pcVar2 = "  time_unit : \"100ps\";\n";
    sStack_80 = 0x17;
    break;
  case 0xb:
    pcVar2 = "  time_unit : \"10ps\";\n";
    sStack_80 = 0x16;
    break;
  case 0xc:
    pcVar2 = "  time_unit : \"1ps\";\n";
LAB_00369d1b:
    sStack_80 = 0x15;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                  ,0x2cd,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
  }
  fwrite(pcVar2,sStack_80,1,__stream);
  pcVar2 = "ff";
  if (p->unit_cap_snd == 0xc) {
    pcVar2 = "pf";
  }
  fprintf(__stream,"  capacitive_load_unit(%.1f,%s);\n",(double)p->unit_cap_fst,pcVar2);
  fputc(10,__stream);
  for (iVar7 = 0; iVar7 < (p->vWireLoads).nSize; iVar7 = iVar7 + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vWireLoads,iVar7);
    fprintf(__stream,"  wire_load(\"%s\") {\n",*puVar3);
    fprintf(__stream,"    capacitance : %f;\n",(double)*(float *)(puVar3 + 1));
    fprintf(__stream,"    slope : %f;\n",(double)*(float *)((long)puVar3 + 0xc));
    for (iVar8 = 0; iVar8 < *(int *)((long)puVar3 + 0x14); iVar8 = iVar8 + 1) {
      uVar1 = Vec_IntEntry((Vec_Int_t *)(puVar3 + 2),iVar8);
      fVar9 = Vec_FltEntry((Vec_Flt_t *)(puVar3 + 4),iVar8);
      fprintf(__stream,"    fanout_length( %d, %f );\n",(double)fVar9,(ulong)uVar1);
    }
    fwrite("  }\n\n",5,1,__stream);
  }
  for (iVar7 = 0; iVar7 < (p->vWireLoadSels).nSize; iVar7 = iVar7 + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vWireLoadSels,iVar7);
    fprintf(__stream,"  wire_load_selection(\"%s\") {\n",*puVar3);
    for (iVar8 = 0; iVar8 < *(int *)((long)puVar3 + 0xc); iVar8 = iVar8 + 1) {
      fVar9 = Vec_FltEntry((Vec_Flt_t *)(puVar3 + 1),iVar8);
      fVar10 = Vec_FltEntry((Vec_Flt_t *)(puVar3 + 3),iVar8);
      pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)(puVar3 + 5),iVar8);
      fprintf(__stream,"    wire_load_from_area( %f, %f, %s );\n",(double)fVar9,(double)fVar10,
              pvVar4);
    }
    fwrite("  }\n\n",5,1,__stream);
  }
  for (iVar7 = 0; iVar8 = (p->vCells).nSize, iVar7 < iVar8; iVar7 = iVar7 + 1) {
    Vec_PtrEntry(&p->vCells,iVar7);
  }
  for (iVar7 = 0; iVar7 < iVar8; iVar7 = iVar7 + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vCells,iVar7);
    if ((*(int *)(puVar3 + 2) == 0) && (*(int *)((long)puVar3 + 0x14) == 0)) {
      fputc(10,__stream);
      fprintf(__stream,"  cell(%s) {\n",*puVar3);
      fprintf(__stream,"    /*  n_inputs = %d  n_outputs = %d */\n",(ulong)*(uint *)(puVar3 + 8),
              (ulong)*(uint *)((long)puVar3 + 0x44));
      fprintf(__stream,"    area : %f;\n",(double)*(float *)(puVar3 + 3));
      fprintf(__stream,"    cell_leakage_power : %f;\n",(double)*(float *)((long)puVar3 + 0x1c));
      fprintf(__stream,"    drive_strength : %d;\n",(ulong)*(uint *)(puVar3 + 5));
      for (iVar8 = 0; i = *(int *)(puVar3 + 8), iVar8 < i; iVar8 = iVar8 + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar3 + 6),iVar8);
        if (*(int *)(puVar5 + 1) != 1) {
          __assert_fail("pPin->dir == sc_dir_Input",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                        ,0x2fc,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
        }
        fprintf(__stream,"    pin(%s) {\n",*puVar5);
        fprintf(__stream,"      direction : %s;\n","input");
        fprintf(__stream,"      fall_capacitance : %f;\n",(double)*(float *)((long)puVar5 + 0x14));
        fprintf(__stream,"      rise_capacitance : %f;\n",(double)*(float *)(puVar5 + 2));
        fwrite("    }\n",6,1,__stream);
      }
      for (; i < *(int *)((long)puVar3 + 0x34); i = i + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar3 + 6),i);
        if (*(int *)(puVar5 + 1) != 2) {
          __assert_fail("pPin->dir == sc_dir_Output",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                        ,0x308,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
        }
        fprintf(__stream,"    pin(%s) {\n",*puVar5);
        fprintf(__stream,"      direction : %s;\n","output");
        fprintf(__stream,"      max_capacitance : %f;\n",(double)*(float *)(puVar5 + 4));
        fprintf(__stream,"      max_transition : %f;\n",(double)*(float *)((long)puVar5 + 0x24));
        pcVar2 = (char *)puVar5[5];
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "?";
        }
        fprintf(__stream,"      function : \"%s\";\n",pcVar2);
        fwrite("      /*  truth table = ",0x18,1,__stream);
        Extra_PrintHex((FILE *)__stream,(uint *)puVar5[7],*(int *)(puVar3 + 8));
        fwrite("  */\n",5,1,__stream);
        iVar8 = *(int *)((long)puVar5 + 0x44);
        if (iVar8 != *(int *)(puVar3 + 8)) {
          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                        ,0x313,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
        }
        for (i_00 = 0; i_00 < iVar8; i_00 = i_00 + 1) {
          puVar6 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar5 + 8),i_00);
          if (*(int *)((long)puVar6 + 0xc) != 0) {
            if (*(int *)((long)puVar6 + 0xc) != 1) {
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                            ,0x335,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
            }
            pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)(puVar6 + 1),0);
            fwrite("      timing() {\n",0x11,1,__stream);
            fprintf(__stream,"        related_pin : \"%s\"\n",*puVar6);
            iVar8 = *(int *)((long)pvVar4 + 8);
            if (iVar8 == 3) {
              pcVar2 = "        timing_sense : non_unate;\n";
              sStack_80 = 0x22;
            }
            else {
              if (iVar8 == 2) {
                pcVar2 = "        timing_sense : negative_unate;\n";
              }
              else {
                if (iVar8 != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                                ,0x321,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
                }
                pcVar2 = "        timing_sense : positive_unate;\n";
              }
              sStack_80 = 0x27;
            }
            fwrite(pcVar2,sStack_80,1,__stream);
            fwrite("        cell_rise() {\n",0x16,1,__stream);
            Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)((long)pvVar4 + 0x18));
            fwrite("        }\n",10,1,__stream);
            fwrite("        cell_fall() {\n",0x16,1,__stream);
            Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)((long)pvVar4 + 200));
            fwrite("        }\n",10,1,__stream);
            fwrite("        rise_transition() {\n",0x1c,1,__stream);
            Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)((long)pvVar4 + 0x178));
            fwrite("        }\n",10,1,__stream);
            fwrite("        fall_transition() {\n",0x1c,1,__stream);
            Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)((long)pvVar4 + 0x228));
            fwrite("        }\n",10,1,__stream);
            fwrite("      }\n",8,1,__stream);
          }
          iVar8 = *(int *)((long)puVar5 + 0x44);
        }
        fwrite("    }\n",6,1,__stream);
      }
      fwrite("  }\n",4,1,__stream);
    }
    iVar8 = (p->vCells).nSize;
  }
  fwrite("}\n\n",3,1,__stream);
  fclose(__stream);
  pcVar2 = "Dumped internal library into Liberty file \"%s\".\n";
LAB_0036a3e6:
  printf(pcVar2,pFileName);
  return;
}

Assistant:

void Abc_SclWriteLiberty( char * pFileName, SC_Lib * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        printf( "Cannot open text file \"%s\" for writing.\n", pFileName );
    else
    {
        Abc_SclWriteLibraryText( pFile, p );
        fclose( pFile );
        printf( "Dumped internal library into Liberty file \"%s\".\n", pFileName );
    }
}